

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slaqgs.c
# Opt level: O1

void slaqgs(SuperMatrix *A,float *r,float *c,float rowcnd,float colcnd,float amax,char *equed)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  char cVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  
  cVar10 = 'N';
  if ((0 < A->nrow) && (0 < A->ncol)) {
    pvVar5 = A->Store;
    lVar6 = *(long *)((long)pvVar5 + 8);
    fVar12 = smach("Safe minimum");
    fVar13 = smach("Precision");
    if ((rowcnd < 0.1) || ((amax < fVar12 / fVar13 || (1.0 / (fVar12 / fVar13) < amax)))) {
      uVar4 = A->ncol;
      if (0.1 <= colcnd) {
        cVar10 = 'R';
        if (0 < (int)uVar4) {
          lVar7 = *(long *)((long)pvVar5 + 0x18);
          uVar9 = 0;
          do {
            iVar1 = *(int *)(lVar7 + uVar9 * 4);
            lVar8 = (long)iVar1;
            iVar2 = *(int *)(lVar7 + 4 + uVar9 * 4);
            if (iVar1 < iVar2) {
              lVar11 = *(long *)((long)pvVar5 + 0x10);
              do {
                *(float *)(lVar6 + lVar8 * 4) =
                     r[*(int *)(lVar11 + lVar8 * 4)] * *(float *)(lVar6 + lVar8 * 4);
                lVar8 = lVar8 + 1;
              } while (iVar2 != lVar8);
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar4);
        }
      }
      else {
        cVar10 = 'B';
        if (0 < (int)uVar4) {
          lVar7 = *(long *)((long)pvVar5 + 0x18);
          uVar9 = 0;
          do {
            iVar1 = *(int *)(lVar7 + uVar9 * 4);
            lVar8 = (long)iVar1;
            iVar2 = *(int *)(lVar7 + 4 + uVar9 * 4);
            if (iVar1 < iVar2) {
              fVar12 = c[uVar9];
              lVar11 = *(long *)((long)pvVar5 + 0x10);
              do {
                *(float *)(lVar6 + lVar8 * 4) =
                     r[*(int *)(lVar11 + lVar8 * 4)] * fVar12 * *(float *)(lVar6 + lVar8 * 4);
                lVar8 = lVar8 + 1;
              } while (iVar2 != lVar8);
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar4);
        }
      }
    }
    else if (colcnd < 0.1) {
      iVar1 = A->ncol;
      cVar10 = 'C';
      if (0 < (long)iVar1) {
        lVar7 = *(long *)((long)pvVar5 + 0x18);
        lVar8 = 0;
        do {
          iVar2 = *(int *)(lVar7 + lVar8 * 4);
          lVar11 = (long)iVar2;
          iVar3 = *(int *)(lVar7 + 4 + lVar8 * 4);
          if (iVar2 < iVar3) {
            fVar12 = c[lVar8];
            do {
              *(float *)(lVar6 + lVar11 * 4) = *(float *)(lVar6 + lVar11 * 4) * fVar12;
              lVar11 = lVar11 + 1;
            } while (iVar3 != lVar11);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != iVar1);
      }
    }
  }
  *equed = cVar10;
  return;
}

Assistant:

void
slaqgs(SuperMatrix *A, float *r, float *c, 
	float rowcnd, float colcnd, float amax, char *equed)
{


#define THRESH    (0.1)
    
    /* Local variables */
    NCformat *Astore;
    float   *Aval;
    int_t i, j;
    int   irow;
    float large, small, cj;


    /* Quick return if possible */
    if (A->nrow <= 0 || A->ncol <= 0) {
	*(unsigned char *)equed = 'N';
	return;
    }

    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Initialize LARGE and SMALL. */
    small = smach("Safe minimum") / smach("Precision");
    large = 1. / small;

    if (rowcnd >= THRESH && amax >= small && amax <= large) {
	if (colcnd >= THRESH)
	    *(unsigned char *)equed = 'N';
	else {
	    /* Column scaling */
	    for (j = 0; j < A->ncol; ++j) {
		cj = c[j];
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    Aval[i] *= cj;
                }
	    }
	    *(unsigned char *)equed = 'C';
	}
    } else if (colcnd >= THRESH) {
	/* Row scaling, no column scaling */
	for (j = 0; j < A->ncol; ++j)
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		irow = Astore->rowind[i];
		Aval[i] *= r[irow];
	    }
	*(unsigned char *)equed = 'R';
    } else {
	/* Row and column scaling */
	for (j = 0; j < A->ncol; ++j) {
	    cj = c[j];
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		irow = Astore->rowind[i];
		Aval[i] *= cj * r[irow];
	    }
	}
	*(unsigned char *)equed = 'B';
    }

    return;

}